

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::BatchNorm_x86_fma::forward_inplace(BatchNorm_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  undefined8 *puVar16;
  long *in_RSI;
  long in_RDI;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  __m128 _p128_2;
  __m256 _p256_2;
  int i_2;
  __m256 _b256_2;
  __m256 _a256_2;
  __m128 _b128_2;
  __m128 _a128_2;
  float b_1;
  float a_1;
  float *ptr_2;
  int q;
  int size_2;
  __m128 _p128_1;
  __m256 _p256_1;
  int j;
  __m256 _b256_1;
  __m256 _a256_1;
  __m128 _b128_1;
  __m128 _a128_1;
  float b;
  float a;
  float *ptr_1;
  int i_1;
  int size_1;
  __m128 _b128;
  __m128 _a128;
  __m128 _p128;
  __m256 _b256;
  __m256 _a256;
  __m256 _p256;
  int i;
  int size;
  float *bptr;
  float *aptr;
  float *ptr;
  int elempack;
  int c;
  int d;
  int h;
  int w;
  int dims;
  Mat *m;
  undefined1 local_a40 [32];
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined1 local_9a0 [32];
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  int local_8e4;
  undefined1 (*local_820) [32];
  int local_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  int local_7c4;
  undefined1 (*local_740) [32];
  int local_738;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  int local_6a0;
  undefined1 (*local_698) [32];
  undefined1 (*local_690) [32];
  undefined1 (*local_688) [32];
  
  iVar15 = (int)in_RSI[5];
  iVar3 = *(int *)((long)in_RSI + 0x2c);
  lVar12 = in_RSI[6];
  iVar4 = *(int *)((long)in_RSI + 0x34);
  lVar13 = in_RSI[7];
  iVar5 = (int)in_RSI[3];
  if (iVar15 == 1) {
    local_688 = (undefined1 (*) [32])*in_RSI;
    local_690 = *(undefined1 (**) [32])(in_RDI + 0x1f8);
    local_698 = *(undefined1 (**) [32])(in_RDI + 0x240);
    iVar14 = iVar3 * iVar5;
    for (local_6a0 = 0; local_6a0 + 7 < iVar14; local_6a0 = local_6a0 + 8) {
      auVar6 = vfmadd213ps_fma(*local_698,*local_688,*local_690);
      local_6c0 = auVar6._0_8_;
      uStack_6b8 = auVar6._8_8_;
      *(undefined8 *)*local_688 = local_6c0;
      *(undefined8 *)(*local_688 + 8) = uStack_6b8;
      *(undefined8 *)(*local_688 + 0x10) = 0;
      *(undefined8 *)(*local_688 + 0x18) = 0;
      local_688 = local_688 + 1;
      local_690 = local_690 + 1;
      local_698 = local_698 + 1;
    }
    for (; local_6a0 + 3 < iVar14; local_6a0 = local_6a0 + 4) {
      auVar6 = vfmadd213ps_fma(*(undefined1 (*) [16])*local_698,*(undefined1 (*) [16])*local_688,
                               *(undefined1 (*) [16])*local_690);
      local_710 = auVar6._0_8_;
      uStack_708 = auVar6._8_8_;
      *(undefined8 *)*local_688 = local_710;
      *(undefined8 *)(*local_688 + 8) = uStack_708;
      local_688 = (undefined1 (*) [32])(*local_688 + 0x10);
      local_690 = (undefined1 (*) [32])(*local_690 + 0x10);
      local_698 = (undefined1 (*) [32])(*local_698 + 0x10);
    }
    for (; local_6a0 < iVar14; local_6a0 = local_6a0 + 1) {
      *(float *)*local_688 = *(float *)*local_698 * *(float *)*local_688 + *(float *)*local_690;
      local_688 = (undefined1 (*) [32])(*local_688 + 4);
      local_690 = (undefined1 (*) [32])(*local_690 + 4);
      local_698 = (undefined1 (*) [32])(*local_698 + 4);
    }
  }
  if (iVar15 == 2) {
    iVar14 = iVar3 * iVar5;
    for (local_738 = 0; local_738 < (int)lVar12; local_738 = local_738 + 1) {
      local_740 = (undefined1 (*) [32])
                  (*in_RSI + (long)*(int *)((long)in_RSI + 0x2c) * (long)local_738 * in_RSI[2]);
      fVar1 = *(float *)(*(long *)(in_RDI + 0x1f8) + (long)local_738 * 4);
      fVar2 = *(float *)(*(long *)(in_RDI + 0x240) + (long)local_738 * 4);
      if (iVar5 == 4) {
        puVar16 = (undefined8 *)(*(long *)(in_RDI + 0x1f8) + (long)(local_738 << 2) * 4);
        uVar7 = *puVar16;
        uVar8 = puVar16[1];
        puVar16 = (undefined8 *)(*(long *)(in_RDI + 0x240) + (long)(local_738 << 2) * 4);
        local_960 = *puVar16;
        uStack_958 = puVar16[1];
      }
      else {
        uVar7 = CONCAT44(fVar1,fVar1);
        uVar8 = CONCAT44(fVar1,fVar1);
        local_960 = CONCAT44(fVar2,fVar2);
        uStack_958 = CONCAT44(fVar2,fVar2);
      }
      if (iVar5 == 8) {
        auVar17 = *(undefined1 (*) [32])(*(long *)(in_RDI + 0x1f8) + (long)(local_738 << 3) * 4);
        local_9a0 = *(undefined1 (*) [32])(*(long *)(in_RDI + 0x240) + (long)(local_738 << 3) * 4);
      }
      else {
        auVar17._8_8_ = uVar8;
        auVar17._0_8_ = uVar7;
        auVar17._24_8_ = uVar8;
        auVar17._16_8_ = uVar7;
        local_9a0._8_8_ = uStack_958;
        local_9a0._0_8_ = local_960;
        local_9a0._24_8_ = uStack_958;
        local_9a0._16_8_ = local_960;
      }
      for (local_7c4 = 0; local_7c4 + 7 < iVar14; local_7c4 = local_7c4 + 8) {
        auVar6 = vfmadd213ps_fma(local_9a0,*local_740,auVar17);
        local_800 = auVar6._0_8_;
        uStack_7f8 = auVar6._8_8_;
        *(undefined8 *)*local_740 = local_800;
        *(undefined8 *)(*local_740 + 8) = uStack_7f8;
        *(undefined8 *)(*local_740 + 0x10) = 0;
        *(undefined8 *)(*local_740 + 0x18) = 0;
        local_740 = local_740 + 1;
      }
      for (; local_7c4 + 3 < iVar14; local_7c4 = local_7c4 + 4) {
        auVar6._8_8_ = uStack_958;
        auVar6._0_8_ = local_960;
        auVar11._8_8_ = uVar8;
        auVar11._0_8_ = uVar7;
        auVar6 = vfmadd213ps_fma(auVar6,*(undefined1 (*) [16])*local_740,auVar11);
        local_810 = auVar6._0_8_;
        uStack_808 = auVar6._8_8_;
        *(undefined8 *)*local_740 = local_810;
        *(undefined8 *)(*local_740 + 8) = uStack_808;
        local_740 = (undefined1 (*) [32])(*local_740 + 0x10);
      }
      for (; local_7c4 < iVar14; local_7c4 = local_7c4 + 1) {
        *(float *)*local_740 = fVar2 * *(float *)*local_740 + fVar1;
        local_740 = (undefined1 (*) [32])(*local_740 + 4);
      }
    }
  }
  if ((iVar15 == 3) || (iVar15 == 4)) {
    iVar15 = iVar3 * (int)lVar12 * iVar4 * iVar5;
    for (local_818 = 0; local_818 < (int)lVar13; local_818 = local_818 + 1) {
      local_820 = (undefined1 (*) [32])(*in_RSI + in_RSI[8] * (long)local_818 * in_RSI[2]);
      fVar1 = *(float *)(*(long *)(in_RDI + 0x1f8) + (long)local_818 * 4);
      fVar2 = *(float *)(*(long *)(in_RDI + 0x240) + (long)local_818 * 4);
      if (iVar5 == 4) {
        puVar16 = (undefined8 *)(*(long *)(in_RDI + 0x1f8) + (long)(local_818 << 2) * 4);
        uVar7 = *puVar16;
        uVar8 = puVar16[1];
        puVar16 = (undefined8 *)(*(long *)(in_RDI + 0x240) + (long)(local_818 << 2) * 4);
        local_9f0 = *puVar16;
        uStack_9e8 = puVar16[1];
      }
      else {
        uVar7 = CONCAT44(fVar1,fVar1);
        uVar8 = CONCAT44(fVar1,fVar1);
        local_9f0 = CONCAT44(fVar2,fVar2);
        uStack_9e8 = CONCAT44(fVar2,fVar2);
      }
      if (iVar5 == 8) {
        auVar18 = *(undefined1 (*) [32])(*(long *)(in_RDI + 0x1f8) + (long)(local_818 << 3) * 4);
        local_a40 = *(undefined1 (*) [32])(*(long *)(in_RDI + 0x240) + (long)(local_818 << 3) * 4);
      }
      else {
        auVar18._8_8_ = uVar8;
        auVar18._0_8_ = uVar7;
        auVar18._24_8_ = uVar8;
        auVar18._16_8_ = uVar7;
        local_a40._8_8_ = uStack_9e8;
        local_a40._0_8_ = local_9f0;
        local_a40._24_8_ = uStack_9e8;
        local_a40._16_8_ = local_9f0;
      }
      for (local_8e4 = 0; local_8e4 + 7 < iVar15; local_8e4 = local_8e4 + 8) {
        auVar6 = vfmadd213ps_fma(local_a40,*local_820,auVar18);
        local_920 = auVar6._0_8_;
        uStack_918 = auVar6._8_8_;
        *(undefined8 *)*local_820 = local_920;
        *(undefined8 *)(*local_820 + 8) = uStack_918;
        *(undefined8 *)(*local_820 + 0x10) = 0;
        *(undefined8 *)(*local_820 + 0x18) = 0;
        local_820 = local_820 + 1;
      }
      for (; local_8e4 + 3 < iVar15; local_8e4 = local_8e4 + 4) {
        auVar9._8_8_ = uStack_9e8;
        auVar9._0_8_ = local_9f0;
        auVar10._8_8_ = uVar8;
        auVar10._0_8_ = uVar7;
        auVar6 = vfmadd213ps_fma(auVar9,*(undefined1 (*) [16])*local_820,auVar10);
        local_930 = auVar6._0_8_;
        uStack_928 = auVar6._8_8_;
        *(undefined8 *)*local_820 = local_930;
        *(undefined8 *)(*local_820 + 8) = uStack_928;
        local_820 = (undefined1 (*) [32])(*local_820 + 0x10);
      }
      for (; local_8e4 < iVar15; local_8e4 = local_8e4 + 1) {
        *(float *)*local_820 = fVar2 * *(float *)*local_820 + fVar1;
        local_820 = (undefined1 (*) [32])(*local_820 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int BatchNorm_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int c = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        float* ptr = bottom_top_blob;
        const float* aptr = a_data;
        const float* bptr = b_data;

        const int size = w * elempack;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p512 = _mm512_loadu_ps(ptr);
            __m512 _a512 = _mm512_loadu_ps(aptr);
            __m512 _b512 = _mm512_loadu_ps(bptr);
            _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
            _mm512_storeu_ps(ptr, _p512);
            ptr += 16;
            aptr += 16;
            bptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p256 = _mm256_loadu_ps(ptr);
            __m256 _a256 = _mm256_loadu_ps(aptr);
            __m256 _b256 = _mm256_loadu_ps(bptr);
            _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
            _mm256_storeu_ps(ptr, _p256);
            ptr += 8;
            aptr += 8;
            bptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p128 = _mm_loadu_ps(ptr);
            __m128 _a128 = _mm_loadu_ps(aptr);
            __m128 _b128 = _mm_loadu_ps(bptr);
            _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
            _mm_storeu_ps(ptr, _p128);
            ptr += 4;
            aptr += 4;
            bptr += 4;
        }
#endif // __SSE__
        for (; i < size; i++)
        {
            *ptr = *bptr * *ptr + *aptr;
            ptr++;
            aptr++;
            bptr++;
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float a = a_data[i];
            float b = b_data[i];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + i * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + i * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; j < size; j++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        const int size = w * h * d * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float a = a_data[q];
            float b = b_data[q];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + q * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + q * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; i < size; i++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    return 0;
}